

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,ArgumentListSyntax **args_2)

{
  ArgumentListSyntax *pAVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  ExtendsClauseSyntax *pEVar7;
  
  pEVar7 = (ExtendsClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExtendsClauseSyntax *)this->endPtr < pEVar7 + 1) {
    pEVar7 = (ExtendsClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pAVar1 = *args_2;
  (pEVar7->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pEVar7->super_SyntaxNode).kind = ExtendsClause;
  (pEVar7->keyword).kind = TVar3;
  (pEVar7->keyword).field_0x2 = uVar4;
  (pEVar7->keyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pEVar7->keyword).rawLen = uVar6;
  (pEVar7->keyword).info = pIVar2;
  (pEVar7->baseName).ptr = args_1;
  pEVar7->arguments = pAVar1;
  (args_1->super_ExpressionSyntax).super_SyntaxNode.parent = &pEVar7->super_SyntaxNode;
  if (pAVar1 != (ArgumentListSyntax *)0x0) {
    (pAVar1->super_SyntaxNode).parent = &pEVar7->super_SyntaxNode;
  }
  return pEVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }